

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_layer_t.h
# Opt level: O1

void __thiscall relu_layer_t::calc_grads(relu_layer_t *this,tensor_t<float> *grad_next_layer)

{
  float *pfVar1;
  int _z;
  int _x;
  int _y;
  float fVar2;
  
  if (0 < (this->super_layer_t).in.size.x) {
    _x = 0;
    do {
      if (0 < (this->super_layer_t).in.size.y) {
        _y = 0;
        do {
          if (0 < (this->super_layer_t).in.size.z) {
            _z = 0;
            do {
              pfVar1 = tensor_t<float>::get(&(this->super_layer_t).in,_x,_y,_z);
              fVar2 = 0.0;
              if (0.0 <= *pfVar1) {
                pfVar1 = tensor_t<float>::get(grad_next_layer,_x,_y,_z);
                fVar2 = *pfVar1;
              }
              pfVar1 = tensor_t<float>::get(&(this->super_layer_t).grads_in,_x,_y,_z);
              *pfVar1 = fVar2;
              _z = _z + 1;
            } while (_z < (this->super_layer_t).in.size.z);
          }
          _y = _y + 1;
        } while (_y < (this->super_layer_t).in.size.y);
      }
      _x = _x + 1;
    } while (_x < (this->super_layer_t).in.size.x);
  }
  return;
}

Assistant:

void calc_grads(tensor_t<float> &grad_next_layer) {
    for (int i = 0; i < in.size.x; i++)
      for (int j = 0; j < in.size.y; j++)
        for (int z = 0; z < in.size.z; z++) {
          grads_in(i, j, z) = (in(i, j, z) < 0) ?
                              (0) :
                              (1 * grad_next_layer(i, j, z));
        }
  }